

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Sintatico::identificador(Sintatico *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,2);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ID valid",&local_39);
    error(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    _Unwind_Resume(extraout_RAX);
  }
  do {
    if ((this->tok & 0xfffffffeU) == 2) {
      eat(this,this->tok);
    }
    bVar1 = Tokens::isEqual((Tokens *)this,this->tok,2);
  } while ((bVar1) || (bVar1 = Tokens::isEqual((Tokens *)this,this->tok,3), bVar1));
  return;
}

Assistant:

void Sintatico::identificador() {
  if (Lexico::isEqual(tok, LETRA)) {
    do {
      switch (tok) {
        case DIGITO: eat(DIGITO); break;
        case LETRA : eat(LETRA) ; break;
      }
    } while (Lexico::isEqual(tok, LETRA) || Lexico::isEqual(tok, DIGITO));
  }
  else {
    error("ID valid");
    exit(0);
  }
}